

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void ParseLabel(void)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  SLabelTableEntry *label;
  char *pcVar8;
  EStatus EVar9;
  char *pcVar10;
  uint32_t uVar11;
  uint uVar12;
  byte *pbVar13;
  uint nvalue;
  aint equPageNum;
  aint local_844;
  char *p;
  char temp [2048];
  
  bVar2 = White();
  if (bVar2) {
    return;
  }
  if ((Options::syx == '\x01') && (iVar4 = ParseDirective(true), iVar4 != 0)) {
    iVar4 = SkipBlanks();
    if (iVar4 != 0) {
      return;
    }
    Error("Unexpected",lp,PASS3);
    return;
  }
  equPageNum = -1;
  pbVar13 = (byte *)temp;
  while ((*lp != '\0' && (bVar2 = White(), !bVar2))) {
    bVar1 = *lp;
    if (((ulong)bVar1 < 0x3e) && ((0x2400080000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
    *pbVar13 = bVar1;
    pbVar13 = pbVar13 + 1;
    lp = lp + 1;
  }
  pcVar10 = lp;
  *pbVar13 = 0;
  cVar3 = *lp;
  uVar11 = 0;
  if (cVar3 == '+') {
    bVar1 = lp[1];
    uVar11 = 0;
    if ((bVar1 - 0x30 < 10) && (iVar4 = isalnum((uint)(byte)lp[2]), iVar4 == 0)) {
      pcVar10 = pcVar10 + 2;
      uVar11 = (int)(char)bVar1 - 0x30;
      cVar3 = *pcVar10;
      lp = pcVar10;
      if (cVar3 != '+') goto LAB_0011df89;
    }
    if ((pcVar10[1] == '*') && (iVar4 = isalnum((uint)(byte)pcVar10[2]), iVar4 == 0)) {
      if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __assert_fail("!sourcePosStack.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                      ,0x283,"void ParseLabel()");
      }
      lp = pcVar10 + 2;
      if (pass == 1) {
        std::vector<TextFilePos,_std::allocator<TextFilePos>_>::push_back
                  (&smartSmcLines,
                   sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1);
        smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].colBegin = 0xffffffff;
LAB_0011df76:
        uVar11 = 1;
      }
      else {
        if ((((ulong)(((long)smartSmcLines.
                             super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)smartSmcLines.
                            super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x18) <= smartSmcIndex) ||
            (pvVar7 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                                (&smartSmcLines,smartSmcIndex),
            pvVar7->filename !=
            sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].filename)) ||
           (pvVar7->line !=
            sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].line)) {
          pcVar10 = "mismatch of smart-SMC positions between passes";
LAB_0011df6c:
          Error(pcVar10,(char *)0x0,PASS3);
          goto LAB_0011df76;
        }
        pvVar7 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                           (&smartSmcLines,smartSmcIndex);
        uVar11 = pvVar7->colBegin;
        if (uVar11 == 0xffffffff) {
          pcVar10 = "unresolved smart-SMC symbol (no significant target)";
          goto LAB_0011df6c;
        }
        pvVar7->colBegin = 0xffffffff;
      }
      smartSmcIndex = smartSmcIndex + 1;
      cVar3 = *lp;
      goto LAB_0011df89;
    }
  }
  else {
LAB_0011df89:
    if (cVar3 == ':') {
      lp = lp + 1;
    }
  }
  SkipBlanks();
  IsLabelNotFound = false;
  if ((byte)temp[0] - 0x30 < 10) {
    if (uVar11 == 0) {
      pbVar13 = (byte *)temp;
      do {
        bVar1 = *pbVar13;
        pbVar13 = pbVar13 + 1;
      } while (bVar1 - 0x30 < 10);
      if (bVar1 == 0) {
        iVar4 = NeedEQU();
        if ((iVar4 == 0) && (iVar4 = NeedDEFL(), iVar4 == 0)) {
          iVar4 = atoi(temp);
          bVar2 = CTemporaryLabelTable::InsertRefresh(&TemporaryLabelTable,iVar4);
          if (bVar2) {
            return;
          }
          pcVar10 = 
          "Temporary labels flow differs in this pass (missing/new temporary label or final pass source difference)"
          ;
          goto LAB_0011dfdc;
        }
        pcVar10 = "Number labels are allowed as address labels only, not for DEFL/=/EQU";
        EVar9 = SUPPRESS;
      }
      else {
        pcVar10 = "Invalid temporary label (not a number)";
        EVar9 = PASS3;
      }
      pcVar8 = temp;
      goto LAB_0011e1c1;
    }
    pcVar10 = "Temporary label can\'t use SMC-offset";
  }
  else {
    bVar2 = isMacroNext();
    if (!bVar2) {
      iVar4 = NeedDEFL();
      iVar5 = NeedEQU();
      if (iVar5 == 0 && iVar4 == 0) {
        p = lp;
        SkipBlanks(&p);
        cVar3 = *p;
        if (cVar3 == '@') {
          p = p + 1;
        }
        pcVar10 = GetID(&p);
        if ((pcVar10 != (char *)0x0) &&
           (iVar6 = CStructureTable::Emit(&StructureTable,pcVar10,temp,&p,(uint)(cVar3 == '@')),
           iVar6 != 0)) {
          if (uVar11 != 0) {
            Error("Structure instance can\'t use SMC-offset",(char *)0x0,PASS3);
          }
          lp = p;
          pcVar10 = ValidateLabel(temp,true,false);
          if (pcVar10 == (char *)0x0) {
            return;
          }
          goto LAB_0011e489;
        }
        local_844 = CurAddress;
      }
      else {
        Relocation::isResultAffected = 0;
        iVar6 = ParseExpressionNoSyntaxError(&lp,&local_844);
        if (iVar6 == 0) {
          Error("Expression error",lp,PASS3);
          local_844 = 0;
        }
        if ((iVar4 != 0) && (IsLabelNotFound != false)) {
          Error("Forward reference",(char *)0x0,EARLY);
        }
        if (((iVar5 != 0) && (bVar2 = comma(&lp), bVar2)) &&
           (iVar6 = ParseExpressionNoSyntaxError(&lp,&equPageNum), iVar6 == 0)) {
          Error("Expression error",lp,PASS3);
          equPageNum = -1;
        }
        iVar6 = SkipBlanks(&lp);
        if (iVar6 == 0) {
          Error("Unexpected",lp,PASS3);
          SkipToEol(&lp);
        }
      }
      nvalue = local_844 + uVar11;
      pcVar10 = ValidateLabel(temp,true,false);
      if (pcVar10 == (char *)0x0) {
        return;
      }
      if (iVar4 == 0) {
        SetLastParsedLabel(pcVar10);
        uVar12 = 0;
      }
      else {
        uVar12 = 2;
      }
      uVar12 = (uint)(uVar11 != 0) * 0x80 + (uint)(iVar5 != 0) * 4 | uVar12;
      if (pass == 2) {
        iVar4 = CLabelTable::Insert(&LabelTable,pcVar10,nvalue,uVar12,(short)equPageNum);
        if (iVar4 == 0) {
          iVar4 = CLabelTable::Update(&LabelTable,pcVar10,nvalue);
          if (iVar4 == 0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                          ,0x307,"void ParseLabel()");
          }
          goto LAB_0011e489;
        }
LAB_0011e301:
        if (pass != 1) goto LAB_0011e489;
        iVar4 = CLabelTable::Insert(&LabelTable,pcVar10,nvalue,uVar12,(short)equPageNum);
        if (iVar4 != 0) goto LAB_0011e489;
        pcVar8 = "Duplicate label";
        EVar9 = EARLY;
      }
      else {
        if (pass != 3) goto LAB_0011e301;
        label = CLabelTable::Find(&LabelTable,pcVar10,true);
        if (label == (SLabelTableEntry *)0x0 && iVar4 != 0) {
          iVar6 = CLabelTable::Insert(&LabelTable,pcVar10,nvalue,uVar12,-1);
          if (iVar6 != 0) {
            label = CLabelTable::Find(&LabelTable,pcVar10,true);
            goto LAB_0011e2a5;
          }
        }
        else {
LAB_0011e2a5:
          if (label != (SLabelTableEntry *)0x0) {
            if (iVar4 == 0) {
              bVar2 = IsSldExportActive();
              if (bVar2) {
                if (iVar5 == 0) {
                  WriteToSldFile((int)label->page,nvalue,'F',pcVar10);
                  iVar4 = (int)label->page;
                }
                else {
                  iVar4 = -1;
                  WriteToSldFile(-1,nvalue,'D',pcVar10);
                }
                pcVar8 = ExportLabelToSld(temp,label);
                WriteToSldFile(iVar4,nvalue,'L',pcVar8);
              }
            }
            else {
              CLabelTable::Insert(&LabelTable,pcVar10,nvalue,uVar12,-1);
            }
            uVar12 = label->value;
            if (nvalue == uVar12) {
              label->updatePass = pass;
            }
            else {
              pcVar8 = (char *)operator_new__(0x800);
              snprintf(pcVar8,0x800,"previous value %u not equal %u",(ulong)uVar12,(ulong)nvalue);
              Warning("Label has different value in pass 3",pcVar8,W_PASS3);
              CLabelTable::Update(&LabelTable,pcVar10,nvalue);
              operator_delete__(pcVar8);
            }
            goto LAB_0011e489;
          }
        }
        pcVar8 = "Label not found";
        EVar9 = PASS3;
      }
      Error(pcVar8,pcVar10,EVar9);
LAB_0011e489:
      operator_delete__(pcVar10);
      return;
    }
    if (uVar11 == 0) {
      SetLastParsedLabel(temp);
      return;
    }
    pcVar10 = "Macro name can\'t use SMC-offset";
  }
LAB_0011dfdc:
  EVar9 = PASS3;
  pcVar8 = (char *)0x0;
LAB_0011e1c1:
  Error(pcVar10,pcVar8,EVar9);
  return;
}

Assistant:

void ParseLabel() {
	if (White()) return;
	if (Options::syx.IsPseudoOpBOF && ParseDirective(true)) {
		if (!SkipBlanks()) Error("Unexpected", lp);
		return;
	}
	char temp[LINEMAX], * tp = temp, * ttp;
	aint val, equPageNum = LABEL_PAGE_UNDEFINED, smcOffset = 0;
	// copy the label name into `temp` array
	while (*lp && !White() && *lp != ':' && *lp != '=' && *lp != '+') {
		*tp = *lp; ++tp; ++lp;
	}
	*tp = 0;
	// handle the special SMC_offset syntax "<label>+<single_digit>"
	if ('+' == lp[0] && isdigit(byte(lp[1])) && !isalnum(byte(lp[2]))) {
		smcOffset = lp[1] - '0';
		lp += 2;
	}
	// handle the special SMC_offset syntax "<label>+*" to target significant immediate of the instruction
	if ('+' == lp[0] && '*' == lp[1] && !isalnum(byte(lp[2]))) {
		assert(!sourcePosStack.empty());
		smcOffset = 1;					// heuristic value 1 for first pass or when something fails
		lp += 2;
		if (1 == pass) {
			// put the current source position into smart-smc (if first pass, or missing record)
			smartSmcLines.push_back(sourcePosStack.back());
			smartSmcLines.back().colBegin = ~0U;		// mark as unresolved
		} else {
			if ((smartSmcLines.size() <= smartSmcIndex)
				|| smartSmcLines.at(smartSmcIndex) != sourcePosStack.back()) {
				Error("mismatch of smart-SMC positions between passes");
			} else {
				auto & smartSmcLine = smartSmcLines.at(smartSmcIndex);
				if (~0U == smartSmcLine.colBegin) {
					Error("unresolved smart-SMC symbol (no significant target)");
				} else {
					smcOffset = smartSmcLine.colBegin;	// use the smart value from previous pass
					smartSmcLine.colBegin = ~0U;		// mark as unsolved again
				}
			}
		}
		++smartSmcIndex;
	}
	if (*lp == ':') ++lp;	// eat the optional colon after label
	tp = temp;
	SkipBlanks();
	IsLabelNotFound = false;
	if (isdigit((byte)*tp)) {
		if (smcOffset) {
			Error("Temporary label can't use SMC-offset");
			return;
		}
		ttp = tp;
		while (*ttp && isdigit((byte)*ttp)) ++ttp;
		if (*ttp) {
			Error("Invalid temporary label (not a number)", temp);
			return;
		}
		if (NeedEQU() || NeedDEFL()) {
			Error("Number labels are allowed as address labels only, not for DEFL/=/EQU", temp, SUPPRESS);
			return;
		}
		val = atoi(tp);
		if (!TemporaryLabelTable.InsertRefresh(val)) {
			Error("Temporary labels flow differs in this pass (missing/new temporary label or final pass source difference)");
		}
	} else {
		if (isMacroNext()) {
			if (smcOffset) Error("Macro name can't use SMC-offset");
			else SetLastParsedLabel(tp);	// store raw label into "last parsed" without adding module/etc
			return;					// and don't add it to labels table at all
		}
		bool IsDEFL = NeedDEFL(), IsEQU = NeedEQU();
		if (IsDEFL || IsEQU) {
			Relocation::isResultAffected = false;
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("Expression error", lp);
				val = 0;
			}
			if (IsLabelNotFound && IsDEFL) Error("Forward reference", NULL, EARLY);
			// check for explicit page defined by EQU
			if (IsEQU && comma(lp)) {
				if (!ParseExpressionNoSyntaxError(lp, equPageNum)) {
					Error("Expression error", lp);
					equPageNum = LABEL_PAGE_UNDEFINED;
				}
			}

			// after EQU/DEFL expressions there must be <EOL>, anything else is syntax error
			// this was added in v1.17.1 after realizing the line `label=$+1 and 7`
			// does evaluate whole "$+1 and 7" as expression, not as instruction `and`
			// (same problem exists with and/or/xor and if you have macro named after operator)
			if (!SkipBlanks(lp)) {
				Error("Unexpected", lp);
				SkipToEol(lp);
			}

		} else {
			int gl = 0;
			char* p = lp,* n;
			SkipBlanks(p);
			if (*p == '@') {
				++p; gl = 1;
			}
			if ((n = GetID(p)) && StructureTable.Emit(n, tp, p, gl)) {
				if (smcOffset) Error("Structure instance can't use SMC-offset");
				lp = p;
				// this was instancing STRUCT, make it also define "main" label for future "local" ones
				tp = ValidateLabel(tp, true);
				if (tp) delete[] tp;
				return;
			}
			val = CurAddress;
		}
		val += smcOffset;
		ttp = tp;
		if (!(tp = ValidateLabel(tp, true))) {
			return;
		}
		// Copy label name to last parsed label variable
		if (!IsDEFL) SetLastParsedLabel(tp);
		unsigned traits = (IsEQU ? LABEL_IS_EQU : 0) | (IsDEFL ? LABEL_IS_DEFL : 0) | (smcOffset ? LABEL_IS_SMC : 0);
		if (pass == LASTPASS) {
			SLabelTableEntry* label = LabelTable.Find(tp, true);
			if (nullptr == label && IsDEFL) {	// DEFL labels can be defined as late as needed (including pass3)
				if (LabelTable.Insert(tp, val, traits)) label = LabelTable.Find(tp, true);
			}
			if (nullptr == label) {		// should have been already defined before last pass
				Error("Label not found", tp);
				delete[] tp;
				return;
			}
			if (IsDEFL) {		//re-set DEFL value
				LabelTable.Insert(tp, val, traits);
			} else if (IsSldExportActive()) {
				// SLD (Source Level Debugging) tracing-data logging
				WriteToSldFile(IsEQU ? -1 : label->page, val, IsEQU ? 'D' : 'F', tp);	//version 0
				WriteToSldFile(IsEQU ? -1 : label->page, val, 'L', ExportLabelToSld(ttp, label));	//version 1
			}

			if (val != label->value) {
				char* buf = new char[LINEMAX];

				SPRINTF2(buf, LINEMAX, "previous value %u not equal %u", label->value, val);
				Warning("Label has different value in pass 3", buf);
				LabelTable.Update(tp, val);

				delete[] buf;
			} else {
				label->updatePass = pass;	// just "touch" it here in third pass
			}
		} else if (pass == 2 && !LabelTable.Insert(tp, val, traits, equPageNum)) {
			if (!LabelTable.Update(tp, val)) assert(false); // unreachable, update will always work after insert failed
		} else if (pass == 1 && !LabelTable.Insert(tp, val, traits, equPageNum)) {
			Error("Duplicate label", tp, EARLY);
		}

// TODO v2.x: this is too complicated in current version: Unreal/Cspect already expect
// EQU/DEFL to be current page or "ROM" = not a big deal as they did change in v1.x course already.
// But also struct labels are set as EQU ones, so this has to split, and many other details.
// (will also need more than LABEL_PAGE_UNDEFINED value to deal with more states)
// 		if (IsEQU && comma(lp)) {	// Device extension: "<label> EQU <address>,<page number>"
// 			if (!DeviceID) {
// 				Error("EQU can set page to label only in device mode", line);
// 				SkipToEol(lp);
// 			} else if (!ParseExpression(lp, oval)) {	// try to read page number into "oval"
// 				Error("Expression error", lp);
// 				oval = -1;
// 			} else if (oval < 0 || Device->PagesCount <= oval) {
// 				ErrorInt("Invalid page number", oval);
// 				oval = -1;
// 			} else {
// 				if (val < 0 || 0xFFFF < val) Warning("The EQU address is outside of 16bit range", line);
// 				CLabelTableEntry* equLabel = LabelTable.Find(tp, true);	// must be already defined + found
// 				equLabel->page = oval;			// set it's page number
// 			}
// 		}

		delete[] tp;
	}
}